

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O2

void __thiscall booster::aio::buffer_impl<char_*>::add(buffer_impl<char_*> *this,char *p,size_t s)

{
  entry tmp;
  value_type local_28;
  
  if (s != 0) {
    if (this->size_ == 1) {
      std::
      vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
      ::push_back(&this->vec_,&this->entry_);
    }
    else if (this->size_ == 0) {
      (this->entry_).ptr = p;
      (this->entry_).size = s;
      this->size_ = 1;
      return;
    }
    local_28.ptr = p;
    local_28.size = s;
    std::
    vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ::push_back(&this->vec_,&local_28);
    this->size_ = (int)((ulong)((long)(this->vec_).
                                      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->vec_).
                                     super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
  }
  return;
}

Assistant:

void add(Pointer p,size_t s)
			{
				if(s==0)
					return;
				if(size_ == 0) {
					entry_.ptr = p;
					entry_.size = s;
					size_ = 1;
					return;
				}
				else if(size_ == 1) {
					vec_.push_back(entry_);
				}
				entry tmp = { p,s };
				vec_.push_back(tmp);
				size_ = vec_.size();
			}